

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O1

int absl::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  ulong uVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long uVar8;
  
  if (0x13 < max_digits) {
    __assert_fail("max_digits <= std::numeric_limits<T>::digits10",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                  ,0xfc,
                  "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                 );
  }
  uVar8 = *out;
  pbVar2 = (byte *)begin;
  if (begin != end && uVar8 == 0) {
    do {
      if ((*pbVar2 != 0x30) || (pbVar2 = pbVar2 + 1, uVar8 != 0)) break;
    } while (pbVar2 != (byte *)end);
  }
  pbVar5 = pbVar2 + max_digits;
  if ((long)end - (long)pbVar2 <= (long)max_digits) {
    pbVar5 = (byte *)end;
  }
  pbVar3 = pbVar2;
  if (pbVar2 < pbVar5) {
    lVar7 = (long)pbVar5 - (long)pbVar2;
    do {
      pbVar3 = pbVar2;
      if (9 < (byte)(*pbVar2 - 0x30)) break;
      uVar1 = uVar8 * 10;
      if (uVar1 < uVar8) {
        __assert_fail("accumulator * base >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                      ,0x10e,
                      "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                     );
      }
      uVar6 = (ulong)(*pbVar2 & 0xf);
      uVar8 = uVar1 + uVar6;
      if (CARRY8(uVar1,uVar6)) {
        __assert_fail("accumulator + digit >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                      ,0x110,
                      "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                     );
      }
      pbVar2 = pbVar2 + 1;
      lVar7 = lVar7 + -1;
      pbVar3 = pbVar5;
    } while (lVar7 != 0);
  }
  if (pbVar3 < end) {
    lVar7 = (long)end - (long)pbVar3;
    bVar4 = false;
    do {
      pbVar2 = pbVar3;
      if (9 < (byte)(*pbVar3 - 0x30)) break;
      bVar4 = (bool)(bVar4 | *pbVar3 != 0x30);
      pbVar3 = pbVar3 + 1;
      lVar7 = lVar7 + -1;
      pbVar2 = (byte *)end;
    } while (lVar7 != 0);
  }
  else {
    bVar4 = false;
    pbVar2 = pbVar3;
  }
  if ((dropped_nonzero_digit != (bool *)0x0) && (bVar4)) {
    *dropped_nonzero_digit = true;
  }
  *out = uVar8;
  return (int)pbVar2 - (int)begin;
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}